

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

double llvm::scalbn(double __x,int __n)

{
  IEEEFloat *rhs;
  long in_RSI;
  undefined4 in_register_0000003c;
  double __x_00;
  double extraout_XMM0_Qa;
  double __x_01;
  double extraout_XMM0_Qa_00;
  double dVar1;
  DoubleAPFloat local_80;
  DoubleAPFloat local_70;
  IEEEFloat local_60;
  IEEEFloat local_48;
  
  rhs = (IEEEFloat *)(in_RSI + 8);
  if (*(undefined1 **)(in_RSI + 8) == semPPCDoubleDouble) {
    detail::DoubleAPFloat::DoubleAPFloat(&local_80,(DoubleAPFloat *)rhs);
    detail::scalbn(__x_01,(int)&local_70);
    APFloat::APFloat((APFloat *)CONCAT44(in_register_0000003c,__n),&local_70,rhs->semantics);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              (&local_70.Floats);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              (&local_80.Floats);
    dVar1 = extraout_XMM0_Qa_00;
  }
  else {
    detail::IEEEFloat::IEEEFloat(&local_60,rhs);
    detail::scalbn(__x_00,(int)&local_48);
    APFloat::APFloat((APFloat *)CONCAT44(in_register_0000003c,__n),&local_48,rhs->semantics);
    detail::IEEEFloat::~IEEEFloat(&local_48);
    detail::IEEEFloat::~IEEEFloat(&local_60);
    dVar1 = extraout_XMM0_Qa;
  }
  return dVar1;
}

Assistant:

inline APFloat scalbn(APFloat X, int Exp, APFloat::roundingMode RM) {
  if (APFloat::usesLayout<detail::IEEEFloat>(X.getSemantics()))
    return APFloat(scalbn(X.U.IEEE, Exp, RM), X.getSemantics());
  if (APFloat::usesLayout<detail::DoubleAPFloat>(X.getSemantics()))
    return APFloat(scalbn(X.U.Double, Exp, RM), X.getSemantics());
  llvm_unreachable("Unexpected semantics");
}